

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

bool __thiscall
ddd::DaTrie<true,_true,_false>::is_target_ex_
          (DaTrie<true,_true,_false> *this,uint32_t base,Edge *edge)

{
  size_t sVar1;
  Bc BVar2;
  ulong upper;
  size_t sVar3;
  Edge *__range2;
  size_t sVar4;
  
  sVar1 = edge->size_;
  for (sVar4 = 0; (sVar1 != sVar4 && (edge->labels_[sVar4] != base)); sVar4 = sVar4 + 1) {
    BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start[edge->labels_[sVar4] ^ base];
    if ((long)BVar2 < 0) {
      upper = edge->size_;
      sVar3 = edge_size_(this,BVar2._4_4_ & 0x7fffffff,upper);
      if (upper <= sVar3) break;
    }
  }
  return sVar1 == sVar4;
}

Assistant:

bool is_target_ex_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (child_pos == ROOT_POS) {
        return false;
      }
      if (bc_[child_pos].is_fixed()) {
        auto node_pos = bc_[child_pos].check();
        if (edge.size() <= edge_size_(node_pos, edge.size())) {
          return false;
        }
      }
    }
    return true;
  }